

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

double calculator::toAny<double>(string *s)

{
  double local_1b0;
  double t;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  string *local_10;
  string *s_local;
  
  local_10 = s;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,(string *)local_10);
  std::istream::operator>>((istream *)local_198,&local_1b0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_1b0;
}

Assistant:

inline T toAny(const std::string& s) {
    std::stringstream ss;
    ss << s;
    T t;
    ss >> t;
    return t;
}